

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTchr.cpp
# Opt level: O2

void __thiscall NaPNTeacher::set_nn(NaPNTeacher *this,NaPNNNUnit *pnNN,uint nSkipFirst)

{
  NaStdBackProp *this_00;
  NaNNUnit *rNN;
  undefined4 *puVar1;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  if (pnNN != (NaPNNNUnit *)0x0) {
    this->pnn = pnNN;
    NaPNNNUnit::need_nn_deck(pnNN,true,nSkipFirst);
    if (this->bpe != (NaStdBackProp *)0x0) {
      (*this->bpe->_vptr_NaStdBackProp[1])();
    }
    this_00 = (NaStdBackProp *)operator_new(0x720);
    rNN = NaPNNNUnit::get_nn_unit(this->pnn);
    NaStdBackProp::NaStdBackProp(this_00,rNN);
    this->bpe = this_00;
    return;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

void
NaPNTeacher::set_nn (NaPNNNUnit* pnNN, unsigned nSkipFirst)
{
    check_tunable();

    if(NULL == pnNN)
	throw(na_null_pointer);

    pnn = pnNN;
    pnn->need_nn_deck(true, nSkipFirst);

    // Create a teacher
    if(NULL != bpe)
        delete bpe;

    // Create teacher and attach NN at the same time
    bpe = new NaStdBackProp(*(pnn->get_nn_unit()));
    //qprop: bpe = new NaQuickProp(*nn);
    if(NULL == bpe)
        throw(na_bad_alloc);
}